

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vertexClustering.cpp
# Opt level: O1

void __thiscall VCFace::VCFace(VCFace *this,int v1,int v2,int v3,VertexGroup *vg,VCCluster *c)

{
  _Rb_tree_header *p_Var1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  double dVar4;
  undefined1 auVar5 [16];
  CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *pCVar6;
  Scalar *tmp_1;
  Vec3d *B;
  Scalar tmp;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  Vector4d plane;
  undefined1 local_118 [8];
  double dStack_110;
  double local_108 [2];
  Vec3d local_f8;
  double dStack_e0;
  CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> local_d8;
  double local_b8;
  undefined8 uStack_b0;
  double local_a8;
  undefined8 uStack_a0;
  double local_98;
  undefined8 uStack_90;
  double local_88;
  double dStack_80;
  Vec3d local_70;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  double local_48;
  undefined8 uStack_40;
  double local_38;
  
  this->v1 = v1;
  this->v2 = v2;
  this->v3 = v3;
  p_Var1 = &(this->neighbor)._M_t._M_impl.super__Rb_tree_header;
  (this->neighbor)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->neighbor)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->neighbor)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->neighbor)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->neighbor)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->cluster = c;
  B = (Vec3d *)(&vg->field_0x8 + (long)v1 * 0x50);
  operator-((Vec3d *)(&vg->field_0x8 + (long)v2 * 0x50),B);
  local_a8 = local_f8.x;
  uStack_a0 = 0;
  local_b8 = local_f8.y;
  uStack_b0 = local_f8.z;
  Vec3d::~Vec3d(&local_f8);
  operator-((Vec3d *)(&vg->field_0x8 + (long)v3 * 0x50),B);
  local_48 = local_f8.x;
  uStack_40 = 0;
  uStack_50 = SUB84(local_a8,0);
  uStack_4c = (undefined4)((ulong)local_a8 >> 0x20);
  local_58 = (undefined4)uStack_b0;
  uStack_54 = uStack_b0._4_4_;
  local_98 = local_f8.x * local_b8;
  uStack_90 = 0;
  local_88 = local_f8.y;
  dStack_80 = local_f8.z;
  Vec3d::~Vec3d(&local_f8);
  local_118 = (undefined1  [8])
              (dStack_80 * local_b8 - (double)CONCAT44(uStack_54,local_58) * local_88);
  dVar8 = local_48 * uStack_b0 - (double)CONCAT44(uStack_4c,uStack_50) * dStack_80;
  local_108[0] = local_a8 * local_88 - local_98;
  dStack_110 = dVar8;
  local_b8 = B->x;
  uStack_b0 = *(double *)(&vg->field_0x10 + (long)v1 * 0x50);
  local_98 = *(double *)(&vg->field_0x18 + (long)v1 * 0x50);
  dVar4 = dVar8 * dVar8 + local_108[0] * local_108[0] + (double)local_118 * (double)local_118;
  local_88 = (double)local_118;
  dStack_80 = dVar8;
  if (dVar4 < 0.0) {
    local_a8 = local_108[0];
    dVar4 = sqrt(dVar4);
    dVar7 = local_a8;
  }
  else {
    dVar4 = SQRT(dVar4);
    dVar7 = local_108[0];
  }
  auVar5._8_8_ = dStack_80;
  auVar5._0_8_ = local_88;
  auVar9._8_4_ = SUB84(dVar4,0);
  auVar9._0_8_ = dVar4;
  auVar9._12_4_ = (int)((ulong)dVar4 >> 0x20);
  auVar9 = divpd(auVar5,auVar9);
  *(undefined1 (*) [16])
   (this->normal).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
   array = auVar9;
  (this->normal).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [2] = dVar7 / dVar4;
  dVar4 = local_108[0] * local_108[0] + dVar8 * dVar8 + (double)local_118 * (double)local_118;
  if (dVar4 < 0.0) {
    dVar4 = sqrt(dVar4);
  }
  else {
    dVar4 = SQRT(dVar4);
  }
  this->area = dVar4 * 0.5;
  operator+(B,(Vec3d *)(&vg->field_0x8 + (long)v2 * 0x50));
  operator+(&local_70,(Vec3d *)(&vg->field_0x8 + (long)v3 * 0x50));
  local_38 = 3.0;
  operator/((Vec3d *)&local_d8,&local_38);
  (this->center).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [0] = local_f8.x;
  (this->center).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [1] = local_f8.y;
  (this->center).super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
  [2] = local_f8.z;
  Vec3d::~Vec3d(&local_f8);
  Vec3d::~Vec3d((Vec3d *)&local_d8);
  Vec3d::~Vec3d(&local_70);
  dVar4 = dVar8 * dVar8 + local_108[0] * local_108[0] + (double)local_118 * (double)local_118;
  if (dVar4 < 0.0) {
    dVar4 = sqrt(dVar4);
  }
  else {
    dVar4 = SQRT(dVar4);
  }
  auVar10._8_8_ = dVar4;
  auVar10._0_8_ = dVar4;
  auVar9 = divpd(_local_118,auVar10);
  local_108[0] = local_108[0] / dVar4;
  local_d8.m_row = 0;
  local_d8.m_col = 1;
  local_d8.m_currentBlockRows = 1;
  local_f8.x = auVar9._0_8_;
  local_d8.m_xpr = (Matrix<double,_4,_1,_0,_4,_1> *)&local_f8;
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator_
                     (&local_d8,(Scalar *)(local_118 + 8));
  pCVar6 = Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator_
                     (pCVar6,local_108);
  dStack_110 = auVar9._8_8_;
  local_70.x = -(uStack_b0 * dStack_110 + local_98 * local_108[0] + local_b8 * auVar9._0_8_);
  Eigen::CommaInitializer<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>::operator_(pCVar6,&local_70.x);
  if ((local_d8.m_currentBlockRows + local_d8.m_row == 4) && (local_d8.m_col == 1)) {
    auVar2._8_4_ = SUB84(local_f8.y * local_f8.x,0);
    auVar2._0_8_ = local_f8.x * local_f8.x;
    auVar2._12_4_ = (int)((ulong)(local_f8.y * local_f8.x) >> 0x20);
    *(undefined1 (*) [16])
     (this->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array =
         auVar2;
    (this->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[2]
         = local_f8.x * local_f8.z;
    (this->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[3]
         = local_f8.x * dStack_e0;
    (this->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[4]
         = local_f8.x * local_f8.y;
    (this->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[5]
         = local_f8.y * local_f8.y;
    (this->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[6]
         = local_f8.y * local_f8.z;
    (this->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[7]
         = local_f8.y * dStack_e0;
    (this->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[8]
         = local_f8.x * local_f8.z;
    (this->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array[9]
         = local_f8.y * local_f8.z;
    (this->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
    [10] = local_f8.z * local_f8.z;
    (this->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
    [0xb] = local_f8.z * dStack_e0;
    (this->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
    [0xc] = local_f8.x * dStack_e0;
    (this->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
    [0xd] = local_f8.y * dStack_e0;
    auVar3._8_4_ = SUB84(dStack_e0 * dStack_e0,0);
    auVar3._0_8_ = dStack_e0 * local_f8.z;
    auVar3._12_4_ = (int)((ulong)(dStack_e0 * dStack_e0) >> 0x20);
    *(undefined1 (*) [16])
     ((this->E).super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.array
     + 0xe) = auVar3;
    VCCluster::addItem(c,this);
    return;
  }
  __assert_fail("((m_row+m_currentBlockRows) == m_xpr.rows() || m_xpr.cols() == 0) && m_col == m_xpr.cols() && \"Too few coefficients passed to comma initializer (operator<<)\""
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/jsc723[P]voronoi-remesh/dependencies/eigen/Eigen/src/Core/CommaInitializer.h"
                ,0x6f,
                "XprType &Eigen::CommaInitializer<Eigen::Matrix<double, 4, 1>>::finished() [MatrixType = Eigen::Matrix<double, 4, 1>]"
               );
}

Assistant:

VCFace::VCFace(int v1, int v2, int v3, VertexGroup* vg, VCCluster* c)
	:v1(v1), v2(v2), v3(v3), cluster(c)
{
	Vertex* p1 = &vg->group[v1];
	Vertex* p2 = &vg->group[v2];
	Vertex* p3 = &vg->group[v3];
	Vector3d u = VCMyvecToEigen(p2->pos - p1->pos);
	Vector3d v = VCMyvecToEigen(p3->pos - p1->pos);
	Vector3d n(u.cross(v)), a(VCMyvecToEigen(p1->pos));
	normal = n.normalized();
	area = 0.5 * sqrt(n.dot(n));
	center = VCMyvecToEigen((p1->pos + p2->pos + p3->pos) / 3);
	n.normalize();
	Vector4d plane;
	plane << n.x() , n.y() , n.z() ,-n.dot(a); 
	E = plane * plane.transpose();
	c->addItem(this);
}